

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_key2ms.c
# Opt level: O0

key2ms_ctx_st * key2ms_newctx(void *provctx)

{
  key2ms_ctx_st *pkVar1;
  PROV_CTX *in_RDI;
  size_t unaff_retaddr;
  key2ms_ctx_st *ctx;
  undefined8 in_stack_fffffffffffffff0;
  
  pkVar1 = (key2ms_ctx_st *)
           CRYPTO_zalloc(unaff_retaddr,(char *)in_RDI,
                         (int)((ulong)in_stack_fffffffffffffff0 >> 0x20));
  if (pkVar1 != (key2ms_ctx_st *)0x0) {
    pkVar1->provctx = in_RDI;
    pkVar1->pvk_encr_level = 2;
  }
  return pkVar1;
}

Assistant:

static struct key2ms_ctx_st *key2ms_newctx(void *provctx)
{
    struct key2ms_ctx_st *ctx = OPENSSL_zalloc(sizeof(*ctx));

    if (ctx != NULL) {
        ctx->provctx = provctx;
        /* This is the strongest encryption level */
        ctx->pvk_encr_level = 2;
    }
    return ctx;
}